

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_ObjAwaken(FParser *this)

{
  AActor *this_00;
  DFsScript *pDVar1;
  AActor *activator;
  
  if (this->t_argc == 0) {
    pDVar1 = this->Script;
    this_00 = (pDVar1->trigger).field_0.p;
    if (this_00 == (AActor *)0x0) {
      return;
    }
    activator = this_00;
    if (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pDVar1->trigger).field_0.p = (AActor *)0x0;
      return;
    }
LAB_00509fef:
    if (((activator->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050a002;
    (pDVar1->trigger).field_0.p = (AActor *)0x0;
  }
  else {
    this_00 = actorvalue(this->t_argv);
    if (this_00 == (AActor *)0x0) {
      return;
    }
    pDVar1 = this->Script;
    activator = (pDVar1->trigger).field_0.p;
    if (activator != (AActor *)0x0) goto LAB_00509fef;
  }
  activator = (AActor *)0x0;
LAB_0050a002:
  AActor::CallActivate(this_00,activator);
  return;
}

Assistant:

void FParser::SF_ObjAwaken(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
   	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(mo)
	{
		mo->CallActivate(Script->trigger);
	}
}